

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * container_repair_after_lazy(container_t *c,uint8_t *type)

{
  int iVar1;
  array_container_t *paVar2;
  bitset_container_t *bc;
  container_t *result;
  uint8_t *type_local;
  container_t *c_local;
  
  c_local = get_writable_copy_if_shared(c,type);
  switch(*type) {
  case '\x01':
    iVar1 = bitset_container_compute_cardinality((bitset_container_t *)c_local);
    ((run_container_t *)c_local)->n_runs = iVar1;
    if (((run_container_t *)c_local)->n_runs < 0x1001) {
      paVar2 = array_container_from_bitset((bitset_container_t *)c_local);
      bitset_container_free((bitset_container_t *)c_local);
      *type = '\x02';
      c_local = paVar2;
    }
    break;
  case '\x02':
    break;
  case '\x03':
    c_local = convert_run_to_efficient_container_and_free((run_container_t *)c_local,type);
    break;
  case '\x04':
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1173,"container_t *container_repair_after_lazy(container_t *, uint8_t *)");
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1175,"container_t *container_repair_after_lazy(container_t *, uint8_t *)");
  }
  return c_local;
}

Assistant:

static inline container_t *container_repair_after_lazy(
    container_t *c, uint8_t *type
){
    c = get_writable_copy_if_shared(c, type);  // !!! unnecessary cloning
    container_t *result = NULL;
    switch (*type) {
        case BITSET_CONTAINER_TYPE: {
            bitset_container_t *bc = CAST_bitset(c);
            bc->cardinality = bitset_container_compute_cardinality(bc);
            if (bc->cardinality <= DEFAULT_MAX_SIZE) {
                result = array_container_from_bitset(bc);
                bitset_container_free(bc);
                *type = ARRAY_CONTAINER_TYPE;
                return result;
            }
            return c; }
        case ARRAY_CONTAINER_TYPE:
            return c;  // nothing to do
        case RUN_CONTAINER_TYPE:
            return convert_run_to_efficient_container_and_free(
                            CAST_run(c), type);
        case SHARED_CONTAINER_TYPE:
            assert(false);
    }
    assert(false);
    __builtin_unreachable();
    return 0;  // unreached
}